

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_counting.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int aiStack_358 [200];
  undefined1 auStack_38 [8];
  int *local_30;
  int local_24;
  undefined8 uStack_20;
  int _;
  unsigned_long __vla_expr0;
  int local_10;
  undefined4 local_c;
  int n;
  
  __vla_expr0 = (unsigned_long)auStack_38;
  local_c = 0;
  local_10 = 200;
  uStack_20 = 200;
  local_30 = aiStack_358;
  local_24 = 0;
  while( true ) {
    if (99 < local_24) {
      std::operator<<((ostream *)&std::cout,"Successfully sorted using counting sort! \n");
      return 0;
    }
    generate_random_arrs(local_30,local_10);
    counting_sort<int>(local_30,local_10);
    bVar1 = std::is_sorted<int*>(local_30,local_30 + local_10);
    if (!bVar1) break;
    local_24 = local_24 + 1;
  }
  __assert_fail("std::is_sorted(arr, arr + n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wasimusu[P]cpp_algorithms/sorting/sort_counting.cpp"
                ,0x28,"int main()");
}

Assistant:

int main() {
    int n = 200;
    int arr[n];
    for (int _ = 0; _ < 100; _++) {
        generate_random_arrs(arr, n);
        counting_sort(arr, n);
        assert(std::is_sorted(arr, arr + n));
    }
    std::cout << "Successfully sorted using counting sort! \n";
    return 0;
}